

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cc
# Opt level: O2

tm * __thiscall iqxmlrpc::Value::operator_cast_to_tm(tm *__return_storage_ptr__,Value *this)

{
  Date_time local_70;
  
  get_datetime(&local_70,this);
  __return_storage_ptr__->tm_zone = local_70.tm_.tm_zone;
  __return_storage_ptr__->tm_isdst = local_70.tm_.tm_isdst;
  *(undefined4 *)&__return_storage_ptr__->field_0x24 = local_70.tm_._36_4_;
  __return_storage_ptr__->tm_gmtoff = local_70.tm_.tm_gmtoff;
  __return_storage_ptr__->tm_mon = local_70.tm_.tm_mon;
  __return_storage_ptr__->tm_year = local_70.tm_.tm_year;
  __return_storage_ptr__->tm_wday = local_70.tm_.tm_wday;
  __return_storage_ptr__->tm_yday = local_70.tm_.tm_yday;
  __return_storage_ptr__->tm_sec = local_70.tm_.tm_sec;
  __return_storage_ptr__->tm_min = local_70.tm_.tm_min;
  __return_storage_ptr__->tm_hour = local_70.tm_.tm_hour;
  __return_storage_ptr__->tm_mday = local_70.tm_.tm_mday;
  Date_time::~Date_time(&local_70);
  return __return_storage_ptr__;
}

Assistant:

Value::operator struct tm() const
{
  return get_datetime().get_tm();
}